

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O1

int __thiscall
QWaitConditionPrivate::wait_relative(QWaitConditionPrivate *this,QDeadlineTimer deadline)

{
  int iVar1;
  long in_FS_OFFSET;
  timespec local_38;
  QDeadlineTimer local_20;
  long local_10;
  
  local_20._8_8_ = deadline._8_8_;
  local_20.t1 = deadline.t1;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.tv_sec = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
  local_38.tv_nsec = (long)&DAT_aaaaaaaaaaaaaaaa;
  local_38.tv_nsec = QDeadlineTimer::deadlineNSecs(&local_20);
  if (local_38.tv_nsec < 0) {
    local_38.tv_sec = 0;
    local_38.tv_nsec = 0;
  }
  else {
    local_38.tv_sec = (ulong)local_38.tv_nsec / 1000000000;
    local_38.tv_nsec = (ulong)local_38.tv_nsec % 1000000000;
  }
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int wait_relative(QDeadlineTimer deadline)
    {
        timespec ti = deadlineToAbstime<QWaitConditionClockId>(deadline);
        return pthread_cond_timedwait(&cond, &mutex, &ti);
    }